

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,curl_llist *list)

{
  curl_malloc_callback p_Var1;
  size_t sVar2;
  void *ne;
  char *pcVar3;
  long lVar4;
  site_blacklist_entry *entry;
  char *port;
  curl_llist *list_local;
  char **sites_local;
  
  if (list->size != 0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  if (sites != (char **)0x0) {
    Curl_llist_init(list,site_blacklist_llist_dtor);
    for (list_local = (curl_llist *)sites; p_Var1 = Curl_cmalloc,
        list_local->head != (curl_llist_element *)0x0; list_local = (curl_llist *)&list_local->tail)
    {
      sVar2 = strlen((char *)list_local->head);
      ne = (*p_Var1)(sVar2 + 0x20);
      if (ne == (void *)0x0) {
        Curl_llist_destroy(list,(void *)0x0);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy((char *)((long)ne + 0x1a),(char *)list_local->head);
      pcVar3 = strchr((char *)((long)ne + 0x1a),0x3a);
      if (pcVar3 == (char *)0x0) {
        *(undefined2 *)((long)ne + 0x18) = 0x50;
      }
      else {
        *pcVar3 = '\0';
        lVar4 = strtol(pcVar3 + 1,(char **)0x0,10);
        *(short *)((long)ne + 0x18) = (short)lVar4;
      }
      Curl_llist_insert_next(list,list->tail,ne,(curl_llist_element *)ne);
    }
  }
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,
                                           struct curl_llist *list)
{
  /* Free the old list */
  if(list->size)
    Curl_llist_destroy(list, NULL);

  if(sites) {
    Curl_llist_init(list, (curl_llist_dtor) site_blacklist_llist_dtor);

    /* Parse the URLs and populate the list */
    while(*sites) {
      char *port;
      struct site_blacklist_entry *entry;

      entry = malloc(sizeof(struct site_blacklist_entry) + strlen(*sites));
      if(!entry) {
        Curl_llist_destroy(list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }
      strcpy(entry->hostname, *sites);

      port = strchr(entry->hostname, ':');
      if(port) {
        *port = '\0';
        port++;
        entry->port = (unsigned short)strtol(port, NULL, 10);
      }
      else {
        /* Default port number for HTTP */
        entry->port = 80;
      }

      Curl_llist_insert_next(list, list->tail, entry, &entry->list);
      sites++;
    }
  }

  return CURLM_OK;
}